

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O2

bool __thiscall MountPoint::parse(MountPoint *this,string *line)

{
  undefined8 *puVar1;
  StringPiece input;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  size_t i;
  ulong uVar5;
  long lVar6;
  StringPiece input_00;
  allocator_type local_61;
  string local_60;
  vector<StringPiece,_std::allocator<StringPiece>_> pieces;
  
  input.str_ = (line->_M_dataplus)._M_p;
  input.len_ = line->_M_string_length;
  SplitStringPiece(&pieces,input,' ');
  if (0x9f < (ulong)((long)pieces.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)pieces.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                          _M_impl.super__Vector_impl_data._M_start)) {
    lVar6 = 0x60;
    for (uVar5 = 6;
        uVar5 < (ulong)((long)pieces.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)pieces.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 4); uVar5 = uVar5 + 1) {
      local_60._M_dataplus._M_p = "-";
      local_60._M_string_length = 1;
      bVar3 = StringPiece::operator==
                        ((StringPiece *)
                         ((long)&(pieces.
                                  super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->str_ + lVar6),
                         (StringPiece *)&local_60);
      if (bVar3) {
        if (uVar5 - ((long)pieces.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)pieces.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 4) == -4) {
          StringPiece::AsString_abi_cxx11_
                    (&local_60,
                     pieces.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                     super__Vector_impl_data._M_start);
          iVar4 = atoi(local_60._M_dataplus._M_p);
          this->mountId = iVar4;
          std::__cxx11::string::~string((string *)&local_60);
          StringPiece::AsString_abi_cxx11_
                    (&local_60,
                     pieces.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                     super__Vector_impl_data._M_start + 1);
          iVar4 = atoi(local_60._M_dataplus._M_p);
          this->parentId = iVar4;
          std::__cxx11::string::~string((string *)&local_60);
          sVar2 = pieces.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                  super__Vector_impl_data._M_start[2].len_;
          (this->deviceId).str_ =
               pieces.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
               super__Vector_impl_data._M_start[2].str_;
          (this->deviceId).len_ = sVar2;
          sVar2 = pieces.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                  super__Vector_impl_data._M_start[3].len_;
          (this->root).str_ =
               pieces.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
               super__Vector_impl_data._M_start[3].str_;
          (this->root).len_ = sVar2;
          sVar2 = pieces.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                  super__Vector_impl_data._M_start[4].len_;
          (this->mountPoint).str_ =
               pieces.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
               super__Vector_impl_data._M_start[4].str_;
          (this->mountPoint).len_ = sVar2;
          SplitStringPiece((vector<StringPiece,_std::allocator<StringPiece>_> *)&local_60,
                           pieces.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                           _M_impl.super__Vector_impl_data._M_start[5],',');
          std::vector<StringPiece,_std::allocator<StringPiece>_>::_M_move_assign
                    (&this->options,&local_60);
          std::_Vector_base<StringPiece,_std::allocator<StringPiece>_>::~_Vector_base
                    ((_Vector_base<StringPiece,_std::allocator<StringPiece>_> *)&local_60);
          std::vector<StringPiece,std::allocator<StringPiece>>::vector<StringPiece*,void>
                    ((vector<StringPiece,std::allocator<StringPiece>> *)&local_60,
                     pieces.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                     super__Vector_impl_data._M_start + 6,
                     (StringPiece *)
                     ((long)&(pieces.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                              _M_impl.super__Vector_impl_data._M_start)->str_ + lVar6),&local_61);
          std::vector<StringPiece,_std::allocator<StringPiece>_>::_M_move_assign
                    (&this->optionalFields,&local_60);
          std::_Vector_base<StringPiece,_std::allocator<StringPiece>_>::~_Vector_base
                    ((_Vector_base<StringPiece,_std::allocator<StringPiece>_> *)&local_60);
          puVar1 = (undefined8 *)
                   ((long)&pieces.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                           _M_impl.super__Vector_impl_data._M_start[1].str_ + lVar6);
          sVar2 = puVar1[1];
          (this->fsType).str_ = (char *)*puVar1;
          (this->fsType).len_ = sVar2;
          puVar1 = (undefined8 *)
                   ((long)&pieces.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                           _M_impl.super__Vector_impl_data._M_start[2].str_ + lVar6);
          sVar2 = puVar1[1];
          (this->mountSource).str_ = (char *)*puVar1;
          (this->mountSource).len_ = sVar2;
          input_00.len_ =
               *(size_t *)
                ((long)&pieces.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl
                        .super__Vector_impl_data._M_start[3].len_ + lVar6);
          input_00.str_ =
               *(char **)((long)&pieces.
                                 super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                                 _M_impl.super__Vector_impl_data._M_start[3].str_ + lVar6);
          SplitStringPiece((vector<StringPiece,_std::allocator<StringPiece>_> *)&local_60,input_00,
                           ',');
          std::vector<StringPiece,_std::allocator<StringPiece>_>::_M_move_assign
                    (&this->superOptions,&local_60);
          std::_Vector_base<StringPiece,_std::allocator<StringPiece>_>::~_Vector_base
                    ((_Vector_base<StringPiece,_std::allocator<StringPiece>_> *)&local_60);
          bVar3 = true;
          goto LAB_0018b7d1;
        }
        break;
      }
      lVar6 = lVar6 + 0x10;
    }
  }
  bVar3 = false;
LAB_0018b7d1:
  std::_Vector_base<StringPiece,_std::allocator<StringPiece>_>::~_Vector_base
            (&pieces.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>);
  return bVar3;
}

Assistant:

bool parse(const string& line) {
    vector<StringPiece> pieces = SplitStringPiece(line, ' ');
    if (pieces.size() < 10)
      return false;
    size_t optionalStart = 0;
    for (size_t i = 6; i < pieces.size(); i++) {
      if (pieces[i] == "-") {
        optionalStart = i + 1;
        break;
      }
    }
    if (optionalStart == 0)
      return false;
    if (optionalStart + 3 != pieces.size())
      return false;
    mountId = atoi(pieces[0].AsString().c_str());
    parentId = atoi(pieces[1].AsString().c_str());
    deviceId = pieces[2];
    root = pieces[3];
    mountPoint = pieces[4];
    options = SplitStringPiece(pieces[5], ',');
    optionalFields =
        vector<StringPiece>(&pieces[6], &pieces[optionalStart - 1]);
    fsType = pieces[optionalStart];
    mountSource = pieces[optionalStart + 1];
    superOptions = SplitStringPiece(pieces[optionalStart + 2], ',');
    return true;
  }